

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O3

U32 __thiscall
LASquadtree::get_level_index(LASquadtree *this,F64 x,F64 y,U32 level,F32 *min,F32 *max)

{
  int iVar1;
  U32 UVar2;
  F32 FVar3;
  F32 FVar4;
  F32 FVar5;
  F32 FVar6;
  F32 FVar7;
  F32 FVar8;
  float fVar9;
  double dVar10;
  float cell_mid_y;
  float cell_mid_x;
  
  FVar8 = this->min_x;
  FVar3 = this->max_x;
  FVar7 = this->min_y;
  FVar5 = this->max_y;
  UVar2 = 0;
  FVar4 = FVar5;
  FVar6 = FVar8;
  if (level != 0) {
    do {
      FVar8 = (F32)(((float)FVar6 + (float)FVar3) * 0.5);
      fVar9 = ((float)FVar7 + (float)FVar4) * 0.5;
      dVar10 = (double)(float)FVar8;
      if ((double)x < dVar10) {
        FVar3 = FVar8;
        FVar8 = FVar6;
      }
      FVar5 = (F32)fVar9;
      if ((double)fVar9 <= (double)y) {
        FVar5 = FVar4;
        FVar7 = (F32)fVar9;
      }
      iVar1 = UVar2 * 4;
      UVar2 = (dVar10 <= (double)x) + 2 + UVar2 * 4;
      if ((double)y < (double)fVar9) {
        UVar2 = (uint)(dVar10 <= (double)x) + iVar1;
      }
      level = level - 1;
      FVar4 = FVar5;
      FVar6 = FVar8;
    } while (level != 0);
  }
  if (min != (F32 *)0x0) {
    *min = FVar8;
    min[1] = FVar7;
  }
  if (max != (F32 *)0x0) {
    *max = FVar3;
    max[1] = FVar5;
  }
  return UVar2;
}

Assistant:

U32 LASquadtree::get_level_index(const F64 x, const F64 y, U32 level, F32* min, F32* max) const
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  float cell_min_x, cell_max_x;
  float cell_min_y, cell_max_y;
  
  cell_min_x = min_x;
  cell_max_x = max_x;
  cell_min_y = min_y;
  cell_max_y = max_y;

  U32 level_index = 0;

  while (level)
  {
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (x < cell_mid_x)
    {
      cell_max_x = cell_mid_x;
    }
    else
    {
      cell_min_x = cell_mid_x;
      level_index |= 1;
    }
    if (y < cell_mid_y)
    {
      cell_max_y = cell_mid_y;
    }
    else
    {
      cell_min_y = cell_mid_y;
      level_index |= 2;
    }
    level--;
  }
  if (min)
  {
    min[0] = cell_min_x;
    min[1] = cell_min_y;
  }
  if (max)
  {
    max[0] = cell_max_x;
    max[1] = cell_max_y;
  }
  return level_index;
}